

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<double,_QVariant>_>::reallocate
          (QMovableArrayOps<std::pair<double,_QVariant>_> *this,qsizetype alloc,
          AllocationOption option)

{
  long lVar1;
  AllocationOption in_EDX;
  qsizetype in_RSI;
  pair<double,_QVariant> *in_RDI;
  long in_FS_OFFSET;
  pair<QTypedArrayData<std::pair<double,_QVariant>_>_*,_std::pair<double,_QVariant>_*> pVar2;
  pair<QTypedArrayData<std::pair<double,_QVariant>_>_*,_std::pair<double,_QVariant>_*> pair;
  pair<double,_QVariant> *local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pVar2 = QTypedArrayData<std::pair<double,_QVariant>_>::reallocateUnaligned
                    ((QTypedArrayData<std::pair<double,_QVariant>_> *)&DAT_aaaaaaaaaaaaaaaa,in_RDI,
                     in_RSI,in_EDX);
  local_10 = pVar2.second;
  if (local_10 == (pair<double,_QVariant> *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      qBadAlloc();
    }
  }
  else {
    in_RDI->first = (double)pVar2.first;
    (in_RDI->second).d.data.shared = (PrivateShared *)local_10;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }